

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall nvim::Nvim::async_get_option(Nvim *this,string *name)

{
  allocator local_39;
  string local_38;
  string *local_18;
  string *name_local;
  Nvim *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"nvim_get_option",&local_39);
  NvimRPC::async_call<std::__cxx11::string>(&this->client_,&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void Nvim::async_get_option(const std::string& name) {
    client_.async_call("nvim_get_option", name);
}